

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O1

Image * Unit_Test::randomRGBImage(Image *__return_storage_ptr__,Image *reference)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = rand();
  uVar2 = rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,reference,(uVar1 & 0x7ff) + (uint)((uVar1 & 0x7ff) == 0),
             (uVar2 & 0x7ff) + (uint)((uVar2 & 0x7ff) == 0),'\x03','\x01');
  anon_unknown.dwarf_1c2c77::fillRandomData(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image randomRGBImage(const PenguinV_Image::Image & reference)
    {
        PenguinV_Image::Image image = reference.generate(randomSize(), randomSize(), PenguinV_Image::RGB);

        fillRandomData( image );

        return image;
    }